

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

ObjectFormatType getDefaultFormat(Triple *T)

{
  bool bVar1;
  ArchType AVar2;
  Triple *T_local;
  
  AVar2 = llvm::Triple::getArch(T);
  switch(AVar2) {
  case UnknownArch:
  case arm:
  case aarch64:
  case thumb:
  case x86:
  case x86_64:
    bVar1 = llvm::Triple::isOSDarwin(T);
    if (bVar1) {
      T_local._4_4_ = MachO;
    }
    else {
      bVar1 = llvm::Triple::isOSWindows(T);
      if (bVar1) {
        T_local._4_4_ = COFF;
      }
      else {
        T_local._4_4_ = ELF;
      }
    }
    break;
  case armeb:
  case aarch64_be:
  case arc:
  case avr:
  case bpfel:
  case bpfeb:
  case hexagon:
  case mips:
  case mipsel:
  case mips64:
  case mips64el:
  case msp430:
  case nios2:
  case ppc64le:
  case r600:
  case amdgcn:
  case riscv32:
  case riscv64:
  case sparc:
  case sparcv9:
  case sparcel:
  case systemz:
  case tce:
  case tcele:
  case thumbeb:
  case xcore:
  case nvptx:
  case nvptx64:
  case le32:
  case le64:
  case amdil:
  case amdil64:
  case hsail:
  case hsail64:
  case spir:
  case spir64:
  case kalimba:
  case shave:
  case lanai:
  case renderscript32:
  case LastArchType:
    T_local._4_4_ = ELF;
    break;
  case ppc:
  case ppc64:
    bVar1 = llvm::Triple::isOSDarwin(T);
    if (bVar1) {
      T_local._4_4_ = MachO;
    }
    else {
      T_local._4_4_ = ELF;
    }
    break;
  case wasm32:
  case wasm64:
    T_local._4_4_ = Wasm;
    break;
  default:
    llvm::llvm_unreachable_internal
              ("unknown architecture",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x2ae);
  }
  return T_local._4_4_;
}

Assistant:

static Triple::ObjectFormatType getDefaultFormat(const Triple &T) {
  switch (T.getArch()) {
  case Triple::UnknownArch:
  case Triple::aarch64:
  case Triple::arm:
  case Triple::thumb:
  case Triple::x86:
  case Triple::x86_64:
    if (T.isOSDarwin())
      return Triple::MachO;
    else if (T.isOSWindows())
      return Triple::COFF;
    return Triple::ELF;

  case Triple::aarch64_be:
  case Triple::arc:
  case Triple::amdgcn:
  case Triple::amdil:
  case Triple::amdil64:
  case Triple::armeb:
  case Triple::avr:
  case Triple::bpfeb:
  case Triple::bpfel:
  case Triple::hexagon:
  case Triple::lanai:
  case Triple::hsail:
  case Triple::hsail64:
  case Triple::kalimba:
  case Triple::le32:
  case Triple::le64:
  case Triple::mips:
  case Triple::mips64:
  case Triple::mips64el:
  case Triple::mipsel:
  case Triple::msp430:
  case Triple::nios2:
  case Triple::nvptx:
  case Triple::nvptx64:
  case Triple::ppc64le:
  case Triple::r600:
  case Triple::renderscript32:
  case Triple::renderscript64:
  case Triple::riscv32:
  case Triple::riscv64:
  case Triple::shave:
  case Triple::sparc:
  case Triple::sparcel:
  case Triple::sparcv9:
  case Triple::spir:
  case Triple::spir64:
  case Triple::systemz:
  case Triple::tce:
  case Triple::tcele:
  case Triple::thumbeb:
  case Triple::xcore:
    return Triple::ELF;

  case Triple::ppc:
  case Triple::ppc64:
    if (T.isOSDarwin())
      return Triple::MachO;
    return Triple::ELF;

  case Triple::wasm32:
  case Triple::wasm64:
    return Triple::Wasm;
  }
  llvm_unreachable("unknown architecture");
}